

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Segment::AppendCluster(Segment *this,Cluster *pCluster)

{
  long lVar1;
  long lVar2;
  Cluster **ppCVar3;
  bool bVar4;
  ulong uVar5;
  Cluster **ppCVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if ((pCluster != (Cluster *)0x0) && (lVar1 = pCluster->m_index, -1 < lVar1)) {
    lVar2 = this->m_clusterCount;
    lVar10 = this->m_clusterPreloadCount;
    uVar8 = this->m_clusterSize;
    if (lVar1 == lVar2 && lVar10 + lVar2 <= (long)uVar8) {
      lVar7 = lVar1;
      if ((long)uVar8 <= lVar10 + lVar2) {
        uVar5 = uVar8 * 2;
        bVar4 = 0 < (long)uVar8;
        uVar8 = 0x800;
        if (bVar4) {
          uVar8 = uVar5;
        }
        ppCVar6 = (Cluster **)
                  operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8,(nothrow_t *)&std::nothrow
                                );
        if (ppCVar6 == (Cluster **)0x0) {
          return false;
        }
        ppCVar3 = this->m_clusters;
        for (lVar9 = 0; lVar10 * 8 + lVar2 * 8 != lVar9; lVar9 = lVar9 + 8) {
          *(undefined8 *)((long)ppCVar6 + lVar9) = *(undefined8 *)((long)ppCVar3 + lVar9);
        }
        if (ppCVar3 != (Cluster **)0x0) {
          operator_delete__(ppCVar3);
          lVar7 = this->m_clusterCount;
          lVar10 = this->m_clusterPreloadCount;
        }
        this->m_clusters = ppCVar6;
        this->m_clusterSize = uVar8;
      }
      if (0 < lVar10) {
        ppCVar6 = this->m_clusters;
        if (ppCVar6[lVar7] == (Cluster *)0x0) {
          return false;
        }
        if (-1 < ppCVar6[lVar7]->m_index) {
          return false;
        }
        if (ppCVar6 + uVar8 <= ppCVar6 + lVar7 + lVar10) {
          return false;
        }
        lVar10 = lVar10 << 3;
        do {
          lVar2 = *(long *)((long)ppCVar6 + lVar10 + lVar7 * 8 + -8);
          if (-1 < *(long *)(lVar2 + 0x10)) {
            return false;
          }
          *(long *)((long)ppCVar6 + lVar10 + lVar7 * 8) = lVar2;
          lVar10 = lVar10 + -8;
        } while (lVar10 != 0);
      }
      this->m_clusters[lVar1] = pCluster;
      this->m_clusterCount = lVar7 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Segment::AppendCluster(Cluster* pCluster) {
  if (pCluster == NULL || pCluster->m_index < 0)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  const long idx = pCluster->m_index;

  if (size < count || idx != m_clusterCount)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;

    Cluster** q = qq;
    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusterPreloadCount > 0) {
    Cluster** const p = m_clusters + m_clusterCount;
    if (*p == NULL || (*p)->m_index >= 0)
      return false;

    Cluster** q = p + m_clusterPreloadCount;
    if (q >= (m_clusters + size))
      return false;

    for (;;) {
      Cluster** const qq = q - 1;
      if ((*qq)->m_index >= 0)
        return false;

      *q = *qq;
      q = qq;

      if (q == p)
        break;
    }
  }

  m_clusters[idx] = pCluster;
  ++m_clusterCount;
  return true;
}